

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O2

void TasDREAM::applyUniformUpdate
               (vector<double,_std::allocator<double>_> *x,double magnitude,
               function<double_()> *get_random01)

{
  double *pdVar1;
  double *v;
  double *pdVar2;
  double dVar3;
  
  if ((magnitude != 0.0) || (NAN(magnitude))) {
    pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
      dVar3 = std::function<double_()>::operator()(get_random01);
      *pdVar2 = (dVar3 + dVar3 + -1.0) * magnitude + *pdVar2;
    }
  }
  return;
}

Assistant:

inline void applyUniformUpdate(std::vector<double> &x, double magnitude, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (magnitude == 0.0) return;
    for(auto &v : x) v += magnitude * (2.0 * get_random01() -1.0);
}